

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_smin8_x86_64(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  char cVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    cVar3 = *(char *)((long)b + uVar2);
    if (*(char *)((long)a + uVar2) < *(char *)((long)b + uVar2)) {
      cVar3 = *(char *)((long)a + uVar2);
    }
    *(char *)((long)d + uVar2) = cVar3;
    uVar2 = uVar2 + 1;
  } while (uVar1 + 8 != uVar2);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_smin8_x86_64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_smin8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        int8_t aa = *(int8_t *)((char *)a + i);
        int8_t bb = *(int8_t *)((char *)b + i);
        int8_t dd = aa < bb ? aa : bb;
        *(int8_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}